

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_settop(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  if (idx < 0) {
    L->top = L->top + (long)idx + 1;
  }
  else {
    pTVar2 = L->top;
    pTVar1 = L->base + (uint)idx;
    if (pTVar2 < pTVar1) {
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1) {
        lj_state_growstack(L,idx - (int)((ulong)((long)pTVar2 - (long)L->base) >> 3));
        pTVar2 = L->top;
      }
      do {
        L->top = pTVar2 + 1;
        (pTVar2->field_2).it = 0xffffffff;
        pTVar2 = L->top;
      } while (pTVar2 < L->base + (uint)idx);
    }
    else {
      L->top = pTVar1;
    }
  }
  return;
}

Assistant:

LUA_API void lua_settop(lua_State *L, int idx)
{
  if (idx >= 0) {
    lj_checkapi(idx <= tvref(L->maxstack) - L->base, "bad stack slot %d", idx);
    if (L->base + idx > L->top) {
      if (L->base + idx >= tvref(L->maxstack))
	lj_state_growstack(L, (MSize)idx - (MSize)(L->top - L->base));
      do { setnilV(L->top++); } while (L->top < L->base + idx);
    } else {
      L->top = L->base + idx;
    }
  } else {
    lj_checkapi(-(idx+1) <= (L->top - L->base), "bad stack slot %d", idx);
    L->top += idx+1;  /* Shrinks top (idx < 0). */
  }
}